

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O2

void __thiscall
duckdb::PerfectHashJoinState::PerfectHashJoinState
          (PerfectHashJoinState *this,ClientContext *context,PhysicalHashJoin *join)

{
  pointer pJVar1;
  Allocator *allocator;
  type expr;
  JoinCondition *cond;
  pointer this_00;
  
  (this->super_OperatorState)._vptr_OperatorState =
       (_func_int **)&PTR__PerfectHashJoinState_027bad38;
  DataChunk::DataChunk(&this->join_keys);
  ExpressionExecutor::ExpressionExecutor(&this->probe_executor,context);
  (this->seq_sel_vec).sel_vector = (sel_t *)0x0;
  (this->seq_sel_vec).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->probe_sel_vec).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->probe_sel_vec).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->build_sel_vec).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->probe_sel_vec).sel_vector = (sel_t *)0x0;
  (this->build_sel_vec).sel_vector = (sel_t *)0x0;
  (this->build_sel_vec).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->seq_sel_vec).selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  allocator = Allocator::Get(context);
  DataChunk::Initialize(&this->join_keys,allocator,&join->condition_types,0x800);
  pJVar1 = (join->super_PhysicalComparisonJoin).conditions.
           super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
           super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (this_00 = (join->super_PhysicalComparisonJoin).conditions.
                 super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pJVar1; this_00 = this_00 + 1)
  {
    expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&this_00->left);
    ExpressionExecutor::AddExpression(&this->probe_executor,expr);
  }
  SelectionVector::Initialize(&this->build_sel_vec,0x800);
  SelectionVector::Initialize(&this->probe_sel_vec,0x800);
  SelectionVector::Initialize(&this->seq_sel_vec,0x800);
  return;
}

Assistant:

PerfectHashJoinState(ClientContext &context, const PhysicalHashJoin &join) : probe_executor(context) {
		join_keys.Initialize(Allocator::Get(context), join.condition_types);
		for (auto &cond : join.conditions) {
			probe_executor.AddExpression(*cond.left);
		}
		build_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
		probe_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
		seq_sel_vec.Initialize(STANDARD_VECTOR_SIZE);
	}